

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O1

void pdqsort_detail::
     pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsSymmetryDetection::computeComponentData(HighsSymmetries_const&)::__1,false>
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,
               anon_class_8_1_56ae1867 comp,int bad_allowed,bool leftmost)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> c;
  int iVar1;
  int iVar2;
  pointer piVar3;
  int *piVar4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var5;
  bool bVar6;
  bool bVar7;
  HighsInt HVar8;
  HighsInt HVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  int *piVar13;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_presolve_HighsSymmetry_cpp:1470:47)>
  __cmp;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var14;
  int *piVar15;
  _DistanceType __len;
  int *piVar16;
  ulong uVar17;
  long lVar18;
  int *piVar19;
  long local_80;
  
  c._M_current = end._M_current + -1;
  do {
    lVar10 = (long)end._M_current - (long)begin._M_current;
    uVar11 = lVar10 >> 2;
    if ((long)uVar11 < 0x18) {
      piVar13 = begin._M_current + 1;
      bVar6 = true;
      if ((leftmost & 1U) == 0) {
        _Var14._M_current = begin._M_current;
        if (piVar13 != end._M_current && begin._M_current != end._M_current) {
          do {
            piVar16 = piVar13;
            iVar1 = _Var14._M_current[1];
            iVar2 = *_Var14._M_current;
            HVar8 = HighsDisjointSets<false>::getSet
                              (&(comp.componentData)->components,
                               ((comp.componentData)->firstUnfixed).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[iVar1]);
            HVar9 = HighsDisjointSets<false>::getSet
                              (&(comp.componentData)->components,
                               ((comp.componentData)->firstUnfixed).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[iVar2]);
            if ((HVar8 < HVar9) ||
               ((HVar8 <= HVar9 &&
                (piVar3 = ((comp.componentData)->numUnfixed).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start, piVar3[iVar1] < piVar3[iVar2])))) {
              iVar1 = *piVar16;
              do {
                do {
                  piVar13 = _Var14._M_current;
                  piVar13[1] = *piVar13;
                  iVar2 = piVar13[-1];
                  HVar8 = HighsDisjointSets<false>::getSet
                                    (&(comp.componentData)->components,
                                     ((comp.componentData)->firstUnfixed).
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start[iVar1]);
                  HVar9 = HighsDisjointSets<false>::getSet
                                    (&(comp.componentData)->components,
                                     ((comp.componentData)->firstUnfixed).
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start[iVar2]);
                  _Var14._M_current = piVar13 + -1;
                } while (HVar8 < HVar9);
              } while ((HVar8 <= HVar9) &&
                      (piVar3 = ((comp.componentData)->numUnfixed).
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start, piVar3[iVar1] < piVar3[iVar2]));
              *piVar13 = iVar1;
            }
            piVar13 = piVar16 + 1;
            _Var14._M_current = piVar16;
          } while (piVar16 + 1 != end._M_current);
          goto LAB_0030622a;
        }
      }
      else if (piVar13 != end._M_current && begin._M_current != end._M_current) {
        local_80 = 0;
        _Var14._M_current = begin._M_current;
        do {
          iVar1 = *piVar13;
          iVar2 = *_Var14._M_current;
          HVar8 = HighsDisjointSets<false>::getSet
                            (&(comp.componentData)->components,
                             ((comp.componentData)->firstUnfixed).
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[iVar1]);
          HVar9 = HighsDisjointSets<false>::getSet
                            (&(comp.componentData)->components,
                             ((comp.componentData)->firstUnfixed).
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[iVar2]);
          if ((HVar8 < HVar9) ||
             ((HVar8 <= HVar9 &&
              (piVar3 = ((comp.componentData)->numUnfixed).
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start, piVar3[iVar1] < piVar3[iVar2])))) {
            iVar1 = *piVar13;
            piVar16 = piVar13 + -1;
            *piVar13 = *_Var14._M_current;
            if (piVar16 != begin._M_current) {
              lVar10 = 0;
              do {
                iVar2 = *(_Var14._M_current + lVar10 + -4);
                HVar8 = HighsDisjointSets<false>::getSet
                                  (&(comp.componentData)->components,
                                   ((comp.componentData)->firstUnfixed).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start[iVar1]);
                HVar9 = HighsDisjointSets<false>::getSet
                                  (&(comp.componentData)->components,
                                   ((comp.componentData)->firstUnfixed).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start[iVar2]);
                if ((HVar9 <= HVar8) &&
                   ((HVar9 < HVar8 ||
                    (piVar3 = ((comp.componentData)->numUnfixed).
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start, piVar3[iVar2] <= piVar3[iVar1]))))
                break;
                *(undefined4 *)((long)_Var14._M_current + lVar10) =
                     *(undefined4 *)((long)_Var14._M_current + lVar10 + -4);
                lVar10 = lVar10 + -4;
              } while (local_80 != lVar10);
              piVar16 = lVar10 + _Var14._M_current;
            }
            *piVar16 = iVar1;
          }
          piVar13 = piVar13 + 1;
          _Var14._M_current = _Var14._M_current + 1;
          local_80 = local_80 + -4;
        } while (piVar13 != end._M_current);
LAB_0030622a:
        bVar6 = true;
      }
    }
    else {
      uVar17 = uVar11 >> 1;
      _Var14._M_current = begin._M_current + uVar17;
      if ((long)uVar11 < 0x81) {
        sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsSymmetryDetection::computeComponentData(HighsSymmetries_const&)::__1>
                  (_Var14,begin,c,comp);
      }
      else {
        sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsSymmetryDetection::computeComponentData(HighsSymmetries_const&)::__1>
                  (begin,_Var14,c,comp);
        sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsSymmetryDetection::computeComponentData(HighsSymmetries_const&)::__1>
                  ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                   (begin._M_current + 1),
                   (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                   (begin._M_current + (uVar17 - 1)),
                   (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                   (end._M_current + -2),comp);
        piVar13 = begin._M_current + uVar17;
        sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsSymmetryDetection::computeComponentData(HighsSymmetries_const&)::__1>
                  ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                   (begin._M_current + 2),
                   (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)(piVar13 + 1),
                   (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                   (end._M_current + -3),comp);
        sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsSymmetryDetection::computeComponentData(HighsSymmetries_const&)::__1>
                  ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                   (begin._M_current + (uVar17 - 1)),_Var14,
                   (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)(piVar13 + 1),
                   comp);
        iVar1 = *begin._M_current;
        *begin._M_current = *piVar13;
        *piVar13 = iVar1;
      }
      if ((leftmost & 1U) == 0) {
        iVar1 = begin._M_current[-1];
        iVar2 = *begin._M_current;
        HVar8 = HighsDisjointSets<false>::getSet
                          (&(comp.componentData)->components,
                           ((comp.componentData)->firstUnfixed).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[iVar1]);
        HVar9 = HighsDisjointSets<false>::getSet
                          (&(comp.componentData)->components,
                           ((comp.componentData)->firstUnfixed).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[iVar2]);
        if ((HVar9 <= HVar8) &&
           ((HVar9 < HVar8 ||
            (piVar3 = ((comp.componentData)->numUnfixed).
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start, piVar3[iVar2] <= piVar3[iVar1])))) {
          iVar1 = *begin._M_current;
          lVar10 = 0;
          while( true ) {
            iVar2 = *(c._M_current + lVar10);
            HVar8 = HighsDisjointSets<false>::getSet
                              (&(comp.componentData)->components,
                               ((comp.componentData)->firstUnfixed).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[iVar1]);
            HVar9 = HighsDisjointSets<false>::getSet
                              (&(comp.componentData)->components,
                               ((comp.componentData)->firstUnfixed).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[iVar2]);
            if ((HVar9 <= HVar8) &&
               ((HVar9 < HVar8 ||
                (piVar3 = ((comp.componentData)->numUnfixed).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start, piVar3[iVar2] <= piVar3[iVar1]))))
            break;
            lVar10 = lVar10 + -4;
          }
          piVar13 = lVar10 + c._M_current;
          if (lVar10 == 0) {
            piVar16 = begin._M_current + 1;
            while (piVar15 = piVar16 + -1, piVar16 + -1 < piVar13) {
              iVar2 = *piVar16;
              HVar8 = HighsDisjointSets<false>::getSet
                                (&(comp.componentData)->components,
                                 ((comp.componentData)->firstUnfixed).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[iVar1]);
              HVar9 = HighsDisjointSets<false>::getSet
                                (&(comp.componentData)->components,
                                 ((comp.componentData)->firstUnfixed).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[iVar2]);
              piVar15 = piVar16;
              if ((HVar8 < HVar9) ||
                 ((piVar16 = piVar16 + 1, HVar8 <= HVar9 &&
                  (piVar3 = ((comp.componentData)->numUnfixed).
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start, piVar3[iVar1] < piVar3[iVar2]))))
              break;
            }
          }
          else {
            piVar16 = begin._M_current + 1;
            do {
              piVar15 = piVar16;
              iVar2 = *piVar15;
              HVar8 = HighsDisjointSets<false>::getSet
                                (&(comp.componentData)->components,
                                 ((comp.componentData)->firstUnfixed).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[iVar1]);
              HVar9 = HighsDisjointSets<false>::getSet
                                (&(comp.componentData)->components,
                                 ((comp.componentData)->firstUnfixed).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[iVar2]);
              if (HVar8 < HVar9) break;
              piVar16 = piVar15 + 1;
            } while ((HVar9 < HVar8) ||
                    (piVar3 = ((comp.componentData)->numUnfixed).
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start, piVar3[iVar2] <= piVar3[iVar1]));
          }
LAB_00306930:
          if (piVar15 < piVar13) {
            iVar2 = *piVar15;
            *piVar15 = *piVar13;
            *piVar13 = iVar2;
            do {
              do {
                piVar13 = piVar13 + -1;
                iVar2 = *piVar13;
                HVar8 = HighsDisjointSets<false>::getSet
                                  (&(comp.componentData)->components,
                                   ((comp.componentData)->firstUnfixed).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start[iVar1]);
                HVar9 = HighsDisjointSets<false>::getSet
                                  (&(comp.componentData)->components,
                                   ((comp.componentData)->firstUnfixed).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start[iVar2]);
              } while (HVar8 < HVar9);
            } while ((HVar8 <= HVar9) &&
                    (piVar3 = ((comp.componentData)->numUnfixed).
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start, piVar3[iVar1] < piVar3[iVar2]));
            piVar16 = piVar15 + 1;
            do {
              piVar15 = piVar16;
              iVar2 = *piVar15;
              HVar8 = HighsDisjointSets<false>::getSet
                                (&(comp.componentData)->components,
                                 ((comp.componentData)->firstUnfixed).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[iVar1]);
              HVar9 = HighsDisjointSets<false>::getSet
                                (&(comp.componentData)->components,
                                 ((comp.componentData)->firstUnfixed).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[iVar2]);
              if (HVar8 < HVar9) break;
              piVar16 = piVar15 + 1;
            } while ((HVar9 < HVar8) ||
                    (piVar3 = ((comp.componentData)->numUnfixed).
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start, piVar3[iVar2] <= piVar3[iVar1]));
            goto LAB_00306930;
          }
          *begin._M_current = *piVar13;
          *piVar13 = iVar1;
          begin._M_current = piVar13 + 1;
          bVar6 = false;
          goto LAB_00306961;
        }
      }
      iVar1 = *begin._M_current;
      lVar18 = 0;
      _Var14._M_current = begin._M_current;
      while( true ) {
        piVar13 = _Var14._M_current + 1;
        iVar2 = *piVar13;
        HVar8 = HighsDisjointSets<false>::getSet
                          (&(comp.componentData)->components,
                           ((comp.componentData)->firstUnfixed).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[iVar2]);
        HVar9 = HighsDisjointSets<false>::getSet
                          (&(comp.componentData)->components,
                           ((comp.componentData)->firstUnfixed).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[iVar1]);
        if ((HVar9 <= HVar8) &&
           ((HVar9 < HVar8 ||
            (piVar3 = ((comp.componentData)->numUnfixed).
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start, piVar3[iVar1] <= piVar3[iVar2])))) break;
        lVar18 = lVar18 + -4;
        _Var14._M_current = piVar13;
      }
      _Var5._M_current = c._M_current;
      if (lVar18 == 0) {
        while (piVar15 = _Var5._M_current, piVar16 = piVar15 + 1, piVar13 < piVar15 + 1) {
          iVar2 = *piVar15;
          HVar8 = HighsDisjointSets<false>::getSet
                            (&(comp.componentData)->components,
                             ((comp.componentData)->firstUnfixed).
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[iVar2]);
          HVar9 = HighsDisjointSets<false>::getSet
                            (&(comp.componentData)->components,
                             ((comp.componentData)->firstUnfixed).
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[iVar1]);
          piVar16 = piVar15;
          if ((HVar8 < HVar9) ||
             ((_Var5._M_current = piVar15 + -1, HVar8 <= HVar9 &&
              (piVar3 = ((comp.componentData)->numUnfixed).
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start, piVar3[iVar2] < piVar3[iVar1])))) break;
        }
      }
      else {
        do {
          piVar16 = _Var5._M_current;
          iVar2 = *piVar16;
          HVar8 = HighsDisjointSets<false>::getSet
                            (&(comp.componentData)->components,
                             ((comp.componentData)->firstUnfixed).
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[iVar2]);
          HVar9 = HighsDisjointSets<false>::getSet
                            (&(comp.componentData)->components,
                             ((comp.componentData)->firstUnfixed).
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[iVar1]);
          if (HVar8 < HVar9) break;
          _Var5._M_current = piVar16 + -1;
        } while ((HVar9 < HVar8) ||
                (piVar3 = ((comp.componentData)->numUnfixed).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start, piVar3[iVar1] <= piVar3[iVar2]));
      }
      piVar15 = piVar16;
      piVar19 = piVar13;
      if (piVar13 < piVar16) {
        do {
          iVar2 = *piVar19;
          *piVar19 = *piVar15;
          *piVar15 = iVar2;
          do {
            do {
              _Var14._M_current = piVar19;
              piVar19 = _Var14._M_current + 1;
              iVar2 = *piVar19;
              HVar8 = HighsDisjointSets<false>::getSet
                                (&(comp.componentData)->components,
                                 ((comp.componentData)->firstUnfixed).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[iVar2]);
              HVar9 = HighsDisjointSets<false>::getSet
                                (&(comp.componentData)->components,
                                 ((comp.componentData)->firstUnfixed).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[iVar1]);
            } while (HVar8 < HVar9);
          } while ((HVar8 <= HVar9) &&
                  (piVar3 = ((comp.componentData)->numUnfixed).
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start, piVar3[iVar2] < piVar3[iVar1]));
          piVar4 = piVar15 + -1;
          do {
            piVar15 = piVar4;
            iVar2 = *piVar15;
            HVar8 = HighsDisjointSets<false>::getSet
                              (&(comp.componentData)->components,
                               ((comp.componentData)->firstUnfixed).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[iVar2]);
            HVar9 = HighsDisjointSets<false>::getSet
                              (&(comp.componentData)->components,
                               ((comp.componentData)->firstUnfixed).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[iVar1]);
            if (HVar8 < HVar9) break;
            piVar4 = piVar15 + -1;
          } while ((HVar9 < HVar8) ||
                  (piVar3 = ((comp.componentData)->numUnfixed).
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start, piVar3[iVar1] <= piVar3[iVar2]));
        } while (piVar19 < piVar15);
      }
      *begin._M_current = *_Var14._M_current;
      *_Var14._M_current = iVar1;
      uVar12 = (long)_Var14._M_current - (long)begin._M_current >> 2;
      _Var5._M_current = _Var14._M_current + 1;
      uVar17 = (long)end._M_current - (long)_Var5._M_current >> 2;
      if (((long)uVar12 < (long)(uVar11 >> 3)) || ((long)uVar17 < (long)(uVar11 >> 3))) {
        bad_allowed = bad_allowed + -1;
        if (bad_allowed == 0) {
          lVar18 = (long)((uVar11 - ((long)(uVar11 - 2) >> 0x3f)) + -2) >> 1;
          do {
            std::
            __adjust_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,int,__gnu_cxx::__ops::_Iter_comp_iter<HighsSymmetryDetection::computeComponentData(HighsSymmetries_const&)::__1>>
                      (begin,lVar18,uVar11,begin._M_current[lVar18],
                       (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_presolve_HighsSymmetry_cpp:1470:47)>
                        )comp.componentData);
            bVar6 = lVar18 != 0;
            lVar18 = lVar18 + -1;
          } while (bVar6);
          bad_allowed = 0;
          bVar6 = true;
          _Var14._M_current = c._M_current;
          if (4 < lVar10) {
            do {
              iVar1 = *_Var14._M_current;
              *_Var14._M_current = *begin._M_current;
              lVar10 = lVar10 + -4;
              bad_allowed = 0;
              std::
              __adjust_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,int,__gnu_cxx::__ops::_Iter_comp_iter<HighsSymmetryDetection::computeComponentData(HighsSymmetries_const&)::__1>>
                        (begin,0,lVar10 >> 2,iVar1,
                         (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_presolve_HighsSymmetry_cpp:1470:47)>
                          )comp.componentData);
              _Var14._M_current = _Var14._M_current + -1;
            } while (4 < lVar10);
            goto LAB_0030622a;
          }
          goto LAB_00306961;
        }
        if (0x17 < (long)uVar12) {
          uVar11 = uVar12 & 0xfffffffffffffffc;
          iVar1 = *begin._M_current;
          *begin._M_current = *(begin._M_current + uVar11);
          *(begin._M_current + uVar11) = iVar1;
          iVar1 = _Var14._M_current[-1];
          _Var14._M_current[-1] = *(_Var14._M_current - uVar11);
          *(_Var14._M_current - uVar11) = iVar1;
          if (0x80 < (long)uVar12) {
            uVar12 = uVar12 >> 2;
            iVar1 = begin._M_current[1];
            begin._M_current[1] = begin._M_current[uVar12 + 1];
            begin._M_current[uVar12 + 1] = iVar1;
            iVar1 = begin._M_current[2];
            begin._M_current[2] = begin._M_current[uVar12 + 2];
            begin._M_current[uVar12 + 2] = iVar1;
            iVar1 = _Var14._M_current[-2];
            _Var14._M_current[-2] = _Var14._M_current[~uVar12];
            _Var14._M_current[~uVar12] = iVar1;
            iVar1 = _Var14._M_current[-3];
            _Var14._M_current[-3] = _Var14._M_current[-2 - uVar12];
            _Var14._M_current[-2 - uVar12] = iVar1;
          }
        }
        if (0x17 < (long)uVar17) {
          iVar1 = _Var14._M_current[1];
          uVar11 = uVar17 & 0xfffffffffffffffc;
          _Var14._M_current[1] = *(uVar11 + 4 + _Var14._M_current);
          *(uVar11 + 4 + _Var14._M_current) = iVar1;
          iVar1 = end._M_current[-1];
          end._M_current[-1] = *(end._M_current - uVar11);
          *(end._M_current - uVar11) = iVar1;
          if (0x80 < (long)uVar17) {
            uVar17 = uVar17 >> 2;
            iVar1 = _Var14._M_current[2];
            _Var14._M_current[2] = _Var14._M_current[uVar17 + 2];
            _Var14._M_current[uVar17 + 2] = iVar1;
            iVar1 = _Var14._M_current[3];
            _Var14._M_current[3] = _Var14._M_current[uVar17 + 3];
            _Var14._M_current[uVar17 + 3] = iVar1;
            iVar1 = end._M_current[-2];
            end._M_current[-2] = end._M_current[~uVar17];
            end._M_current[~uVar17] = iVar1;
            iVar1 = end._M_current[-3];
            end._M_current[-3] = end._M_current[-2 - uVar17];
            end._M_current[-2 - uVar17] = iVar1;
          }
        }
      }
      else if ((piVar16 <= piVar13) &&
              (bVar6 = partial_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsSymmetryDetection::computeComponentData(HighsSymmetries_const&)::__1>
                                 (begin,_Var14,comp), bVar6)) {
        bVar7 = partial_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsSymmetryDetection::computeComponentData(HighsSymmetries_const&)::__1>
                          (_Var5,end,comp);
        bVar6 = true;
        if (bVar7) goto LAB_00306961;
      }
      pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsSymmetryDetection::computeComponentData(HighsSymmetries_const&)::__1,false>
                (begin,_Var14,comp,bad_allowed,(bool)(leftmost & 1));
      bVar6 = false;
      leftmost = false;
      begin._M_current = _Var5._M_current;
    }
LAB_00306961:
    if (bVar6) {
      return;
    }
  } while( true );
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }